

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandQueueVkImpl.cpp
# Opt level: O2

void __thiscall Diligent::SyncPointVk::~SyncPointVk(SyncPointVk *this)

{
  ulong uVar1;
  SyncPointVk *this_00;
  
  this_00 = this + 1;
  for (uVar1 = 1; uVar1 < this->m_NumSemaphores; uVar1 = uVar1 + 1) {
    VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::
    ~RecycledSyncObject((RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *)this_00);
    this_00 = (SyncPointVk *)
              &(this_00->m_Fence).m_pManager.
               super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount;
  }
  VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::
  ~RecycledSyncObject(this->m_Semaphores);
  VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkFenceType>::
  ~RecycledSyncObject(&this->m_Fence);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<Diligent::SyncPointVk>)._M_weak_this.
              super___weak_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

SyncPointVk::~SyncPointVk()
{
    // Call destructors for semaphores
    for (Uint32 s = _countof(m_Semaphores); s < m_NumSemaphores; ++s)
        m_Semaphores[s].~RecycledSyncObject();
}